

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.h
# Opt level: O0

void __thiscall libmatroska::KaxSimpleBlock::~KaxSimpleBlock(KaxSimpleBlock *this)

{
  KaxSimpleBlock *this_local;
  
  ~KaxSimpleBlock(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

class MATROSKA_DLL_API KaxSimpleBlock : public KaxInternalBlock {
  public:
    KaxSimpleBlock(EBML_EXTRA_PARAM) :KaxInternalBlock(EBML_DEF_BINARY_CTX(KaxSimpleBlock)EBML_DEF_SEP true EBML_DEF_SEP EBML_EXTRA_CALL) {}

    void SetKeyframe(bool b_keyframe) { bIsKeyframe = b_keyframe; }
    void SetDiscardable(bool b_discard) { bIsDiscardable = b_discard; }

    bool IsKeyframe() const    { return bIsKeyframe; }
    bool IsDiscardable() const { return bIsDiscardable; }

    void SetParent(KaxCluster & aParentCluster);

        EBML_CONCRETE_CLASS(KaxSimpleBlock)
};
#endif // MATROSKA_VERSION

/// Placeholder class for either a BlockGroup or a SimpleBlock
class MATROSKA_DLL_API KaxBlockBlob {
public:
  KaxBlockBlob(BlockBlobType sblock_mode) :ParentCluster(NULL), SimpleBlockMode(sblock_mode) {
    bUseSimpleBlock = (sblock_mode != BLOCK_BLOB_NO_SIMPLE);
    Block.group = NULL;
  }

  ~KaxBlockBlob() {
#if MATROSKA_VERSION >= 2
    if (bUseSimpleBlock)
      delete Block.simpleblock;
    else
#endif // MATROSKA_VERSION
      delete Block.group;
  }

  operator KaxBlockGroup &();
  operator const KaxBlockGroup &() const;
#if MATROSKA_VERSION >= 2
  operator KaxSimpleBlock &();
#endif
  operator KaxInternalBlock &();
  operator const KaxInternalBlock &() const;

  void SetBlockGroup( KaxBlockGroup &BlockRef );

  void SetBlockDuration(uint64 TimeLength);

  void SetParent(KaxCluster & aParentCluster);
  bool AddFrameAuto(const KaxTrackEntry & track, uint64 timecode, DataBuffer & buffer, LacingType lacing = LACING_AUTO, const KaxBlockBlob * PastBlock = NULL, const KaxBlockBlob * ForwBlock = NULL);

  bool IsSimpleBlock() const {return bUseSimpleBlock;}

  bool ReplaceSimpleByGroup();
protected:
  KaxCluster * ParentCluster;
  union {
    KaxBlockGroup *group;
#if MATROSKA_VERSION >= 2
    KaxSimpleBlock *simpleblock;
#endif // MATROSKA_VERSION
  } Block;
  bool bUseSimpleBlock;
  BlockBlobType SimpleBlockMode;
}